

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Bt2_MatchFinder_Skip(void *_p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  int iVar1;
  UInt32 pos1;
  UInt32 lenLimit;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  CMatchFinder *p;
  UInt32 num_local;
  void *_p_local;
  
  p._4_4_ = num;
  do {
    lenLimit_00 = *(uint *)((long)_p + 0x14);
    if (lenLimit_00 < 2) {
      MatchFinder_MovePos((CMatchFinder *)_p);
    }
    else {
      curMatch_00 = *(UInt32 *)(*(long *)((long)_p + 0x28) + (ulong)(uint)**_p * 4);
      *(undefined4 *)(*(long *)((long)_p + 0x28) + (ulong)(uint)**_p * 4) =
           *(undefined4 *)((long)_p + 8);
      SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)((long)_p + 8),*_p,
                      *(CLzRef **)((long)_p + 0x30),(ulong)*(uint *)((long)_p + 0x18),
                      *(UInt32 *)((long)_p + 0x1c),*(UInt32 *)((long)_p + 0x3c));
      *(int *)((long)_p + 0x18) = *(int *)((long)_p + 0x18) + 1;
      *(long *)_p = *_p + 1;
      iVar1 = *(int *)((long)_p + 8) + 1;
      *(int *)((long)_p + 8) = iVar1;
      if (iVar1 == *(int *)((long)_p + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)_p);
      }
    }
    p._4_4_ = p._4_4_ - 1;
  } while (p._4_4_ != 0);
  return;
}

Assistant:

static void Bt2_MatchFinder_Skip(void *_p, UInt32 num)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  SKIP_HEADER(2)
  {
    HASH2_CALC
    curMatch = p->hash[hv];
    p->hash[hv] = p->pos;
  }
  SKIP_FOOTER
}